

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O1

S2CellId S2CellId::FromFaceIJWrap(int face,int i,int j)

{
  int face_00;
  S2CellId SVar1;
  int iVar2;
  int j_00;
  int iVar3;
  double dVar4;
  double v;
  double u;
  S2Point local_48;
  double local_30;
  double local_28;
  
  if (0x3fffffff < i) {
    i = 0x40000000;
  }
  if (i < 0) {
    i = -1;
  }
  iVar3 = 0x40000000;
  if (j < 0x40000000) {
    iVar3 = j;
  }
  if (iVar3 < 0) {
    iVar3 = -1;
  }
  local_28 = (double)(i * 2 + -0x3fffffff) * 9.313225746154785e-10;
  if (1.0000000000000002 <= local_28) {
    local_28 = 1.0000000000000002;
  }
  if (local_28 <= -1.0000000000000002) {
    local_28 = -1.0000000000000002;
  }
  local_30 = (double)(iVar3 * 2 + -0x3fffffff) * 9.313225746154785e-10;
  if (1.0000000000000002 <= local_30) {
    local_30 = 1.0000000000000002;
  }
  if (local_30 <= -1.0000000000000002) {
    local_30 = -1.0000000000000002;
  }
  local_48.c_[1] = local_28;
  local_48.c_[2] = local_30;
  local_48.c_[0] = local_30;
  switch(face) {
  case 0:
    local_48.c_[0] = 1.0;
    break;
  case 1:
    local_48.c_[0] = -local_28;
    local_48.c_[1] = 1.0;
    break;
  case 2:
    local_48.c_[0] = -local_28;
    local_48.c_[1] = -local_30;
    local_48.c_[2] = 1.0;
    break;
  case 3:
    local_48.c_[0] = -1.0;
    local_48.c_[1] = -local_30;
    local_48.c_[2] = -local_28;
    break;
  case 4:
    local_48.c_[1] = -1.0;
    local_48.c_[2] = -local_28;
    break;
  default:
    local_48.c_[2] = -1.0;
  }
  iVar3 = (ABS(local_48.c_[1]) <= ABS(local_48.c_[2])) + 1;
  if (ABS(local_48.c_[1]) < ABS(local_48.c_[0])) {
    iVar3 = (uint)(ABS(local_48.c_[0]) <= ABS(local_48.c_[2])) * 2;
  }
  dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                    ((BasicVector<Vector3,_double,_3UL> *)&local_48,iVar3);
  face_00 = iVar3 + 3;
  if (0.0 <= dVar4) {
    face_00 = iVar3;
  }
  S2::ValidFaceXYZtoUV(face_00,&local_48,&local_28,&local_30);
  iVar3 = (int)ROUND((local_28 + 1.0) * 0.5 * 1073741824.0 + -0.5);
  if (0x3ffffffe < iVar3) {
    iVar3 = 0x3fffffff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar2 = (int)ROUND((local_30 + 1.0) * 0.5 * 1073741824.0 + -0.5);
  j_00 = 0x3fffffff;
  if (iVar2 < 0x3fffffff) {
    j_00 = iVar2;
  }
  if (j_00 < 1) {
    j_00 = 0;
  }
  SVar1 = FromFaceIJ(face_00,iVar3,j_00);
  return (S2CellId)SVar1.id_;
}

Assistant:

S2CellId S2CellId::FromFaceIJWrap(int face, int i, int j) {
  // Convert i and j to the coordinates of a leaf cell just beyond the
  // boundary of this face.  This prevents 32-bit overflow in the case
  // of finding the neighbors of a face cell.
  i = max(-1, min(kMaxSize, i));
  j = max(-1, min(kMaxSize, j));

  // We want to wrap these coordinates onto the appropriate adjacent face.
  // The easiest way to do this is to convert the (i,j) coordinates to (x,y,z)
  // (which yields a point outside the normal face boundary), and then call
  // S2::XYZtoFaceUV() to project back onto the correct face.
  //
  // The code below converts (i,j) to (si,ti), and then (si,ti) to (u,v) using
  // the linear projection (u=2*s-1 and v=2*t-1).  (The code further below
  // converts back using the inverse projection, s=0.5*(u+1) and t=0.5*(v+1).
  // Any projection would work here, so we use the simplest.)  We also clamp
  // the (u,v) coordinates so that the point is barely outside the
  // [-1,1]x[-1,1] face rectangle, since otherwise the reprojection step
  // (which divides by the new z coordinate) might change the other
  // coordinates enough so that we end up in the wrong leaf cell.
  static const double kScale = 1.0 / kMaxSize;
  static const double kLimit = 1.0 + DBL_EPSILON;
  // The arithmetic below is designed to avoid 32-bit integer overflows.
  S2_DCHECK_EQ(0, kMaxSize % 2);
  double u = max(-kLimit, min(kLimit, kScale * (2 * (i - kMaxSize / 2) + 1)));
  double v = max(-kLimit, min(kLimit, kScale * (2 * (j - kMaxSize / 2) + 1)));

  // Find the leaf cell coordinates on the adjacent face, and convert
  // them to a cell id at the appropriate level.
  face = S2::XYZtoFaceUV(S2::FaceUVtoXYZ(face, u, v), &u, &v);
  return FromFaceIJ(face, S2::STtoIJ(0.5*(u+1)), S2::STtoIJ(0.5*(v+1)));
}